

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O2

void __thiscall IlmThread_2_5::ThreadPool::ThreadPool(ThreadPool *this,uint nthreads)

{
  Data *this_00;
  DefaultThreadPoolProvider *this_01;
  
  this->_vptr_ThreadPool = (_func_int **)&PTR__ThreadPool_00108c10;
  this_00 = (Data *)operator_new(0x10);
  Data::Data(this_00);
  this->_data = this_00;
  if (nthreads == 0) {
    this_01 = (DefaultThreadPoolProvider *)operator_new(8);
    (this_01->super_ThreadPoolProvider)._vptr_ThreadPoolProvider =
         (_func_int **)&PTR__ThreadPoolProvider_00108c90;
  }
  else {
    this_01 = (DefaultThreadPoolProvider *)operator_new(0xe0);
    anon_unknown_5::DefaultThreadPoolProvider::DefaultThreadPoolProvider(this_01,nthreads);
  }
  Data::setProvider(this_00,&this_01->super_ThreadPoolProvider);
  return;
}

Assistant:

ThreadPool::ThreadPool (unsigned nthreads):
    _data (new Data)
{
    if ( nthreads == 0 )
        _data->setProvider( new NullThreadPoolProvider );
    else
        _data->setProvider( new DefaultThreadPoolProvider( int(nthreads) ) );
}